

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# by_dir.cc
# Opt level: O0

int dir_ctrl(X509_LOOKUP *ctx,int cmd,char *argp,long argl,char **retp)

{
  BY_DIR *ctx_00;
  char *pcVar1;
  BY_DIR *ld;
  char *dir;
  int ret;
  char **retp_local;
  long argl_local;
  char *argp_local;
  int cmd_local;
  X509_LOOKUP *ctx_local;
  
  dir._4_4_ = 0;
  ctx_00 = (BY_DIR *)ctx->method_data;
  if (cmd == 2) {
    if (argl == 3) {
      pcVar1 = X509_get_default_cert_dir_env();
      pcVar1 = getenv(pcVar1);
      if (pcVar1 == (char *)0x0) {
        pcVar1 = X509_get_default_cert_dir();
        dir._4_4_ = add_cert_dir(ctx_00,pcVar1,1);
      }
      else {
        dir._4_4_ = add_cert_dir(ctx_00,pcVar1,1);
      }
      if (dir._4_4_ == 0) {
        ERR_put_error(0xb,0,0x75,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/by_dir.cc"
                      ,0x52);
      }
    }
    else {
      dir._4_4_ = add_cert_dir(ctx_00,argp,(int)argl);
    }
  }
  return dir._4_4_;
}

Assistant:

static int dir_ctrl(X509_LOOKUP *ctx, int cmd, const char *argp, long argl,
                    char **retp) {
  int ret = 0;
  char *dir = NULL;

  BY_DIR *ld = reinterpret_cast<BY_DIR *>(ctx->method_data);

  switch (cmd) {
    case X509_L_ADD_DIR:
      if (argl == X509_FILETYPE_DEFAULT) {
        dir = (char *)getenv(X509_get_default_cert_dir_env());
        if (dir) {
          ret = add_cert_dir(ld, dir, X509_FILETYPE_PEM);
        } else {
          ret =
              add_cert_dir(ld, X509_get_default_cert_dir(), X509_FILETYPE_PEM);
        }
        if (!ret) {
          OPENSSL_PUT_ERROR(X509, X509_R_LOADING_CERT_DIR);
        }
      } else {
        ret = add_cert_dir(ld, argp, (int)argl);
      }
      break;
  }
  return ret;
}